

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cx_string.hpp
# Opt level: O3

cx_string<26UL> * __thiscall
mserialize::cx_strcat<8ul,6ul,2ul,8ul,1ul,1ul>
          (cx_string<26UL> *__return_storage_ptr__,mserialize *this,cx_string<8UL> *strings,
          cx_string<6UL> *strings_1,cx_string<2UL> *strings_2,cx_string<8UL> *strings_3,
          cx_string<1UL> *strings_4,cx_string<1UL> *strings_5)

{
  long lVar1;
  ulong uVar2;
  undefined8 *puVar3;
  ulong auStack_a8 [8];
  long lStack_68;
  mserialize *local_60;
  cx_string<8UL> *local_58;
  cx_string<6UL> *local_50;
  cx_string<2UL> *local_48;
  cx_string<8UL> *local_40;
  cx_string<1UL> *local_38;
  undefined8 local_28;
  undefined2 uStack_20;
  undefined1 uStack_1e;
  undefined5 uStack_1d;
  undefined2 uStack_18;
  undefined1 uStack_16;
  undefined7 uStack_15;
  
  puVar3 = &local_28;
  uStack_18 = 0;
  uStack_16 = 0;
  uStack_15 = 0;
  local_28 = 0;
  uStack_20 = 0;
  uStack_1e = 0;
  uStack_1d = 0;
  local_60 = this;
  local_58 = strings;
  local_50 = strings_1;
  local_48 = strings_2;
  local_40 = strings_3;
  local_38 = strings_4;
  auStack_a8[1] = 8;
  auStack_a8[2] = 6;
  auStack_a8[3] = 2;
  auStack_a8[4] = 8;
  lVar1 = 1;
  auStack_a8[5] = 1;
  auStack_a8[6] = 1;
  do {
    if (auStack_a8[lVar1] != 0) {
      uVar2 = 0;
      do {
        *(undefined1 *)((long)puVar3 + uVar2) = *(undefined1 *)((&lStack_68)[lVar1] + uVar2);
        uVar2 = uVar2 + 1;
      } while (uVar2 < auStack_a8[lVar1]);
      puVar3 = (undefined8 *)((long)puVar3 + uVar2);
    }
    lVar1 = lVar1 + 1;
  } while (lVar1 != 7);
  __return_storage_ptr__->_data[0x1a] = '\0';
  *(undefined8 *)__return_storage_ptr__->_data = local_28;
  *(ulong *)(__return_storage_ptr__->_data + 8) = CONCAT53(uStack_1d,CONCAT12(uStack_1e,uStack_20));
  *(ulong *)(__return_storage_ptr__->_data + 10) = CONCAT26(uStack_18,CONCAT51(uStack_1d,uStack_1e))
  ;
  *(ulong *)(__return_storage_ptr__->_data + 0x12) = CONCAT71(uStack_15,uStack_16);
  return __return_storage_ptr__;
}

Assistant:

constexpr auto cx_strcat(const cx_string<N>&&... strings)
{
  char buffer[detail::sum<N...>()+1] = {0};
  const char* data[] = {"", strings.data()...};
  const std::size_t size[] = {0, strings.size()...};

  char* out = buffer;
  for (std::size_t i = 1; i <= sizeof...(N); ++i)
  {
    for (std::size_t s = 0; s < size[i]; ++s) { *out++ = data[i][s]; } // NOLINT
  }

  return cx_string<sizeof(buffer)-1>(buffer);
}